

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::MILSpec::TensorValue::ByteSizeLong(TensorValue *this)

{
  bool bVar1;
  ValueCase VVar2;
  int size;
  long lVar3;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  TensorValue *this_local;
  
  _cached_size = 0;
  VVar2 = value_case(this);
  switch(VVar2) {
  case VALUE_NOT_SET:
    break;
  case kFloats:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>
                             ((this->value_).floats_);
    _cached_size = _cached_size + 1;
    break;
  case kInts:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                             ((this->value_).ints_);
    _cached_size = _cached_size + 1;
    break;
  case kBools:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                             ((this->value_).bools_);
    _cached_size = _cached_size + 1;
    break;
  case kStrings:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                             ((this->value_).strings_);
    _cached_size = _cached_size + 1;
    break;
  case kLongInts:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                             ((this->value_).longints_);
    _cached_size = _cached_size + 1;
    break;
  case kDoubles:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                             ((this->value_).doubles_);
    _cached_size = _cached_size + 1;
    break;
  case kBytes:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                             ((this->value_).bytes_);
    _cached_size = _cached_size + 1;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t TensorValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (value_case()) {
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
    case kFloats: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.floats_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
    case kInts: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.ints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
    case kBools: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.bools_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
    case kStrings: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.strings_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
    case kLongInts: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.longints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
    case kDoubles: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.doubles_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
    case kBytes: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.bytes_);
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}